

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

uint32_t __thiscall
asmjit::CodeHolder::labelIdByName(CodeHolder *this,char *name,size_t nameSize,uint32_t parentId)

{
  uint32_t uVar1;
  int iVar2;
  ZoneHashNode *__s1;
  uint uVar3;
  ZoneHashNode *pZVar4;
  ulong __n;
  size_t nameSize_local;
  
  nameSize_local = nameSize;
  uVar1 = CodeHolder_hashNameAndGetSize(name,&nameSize_local);
  if (nameSize_local == 0) {
    uVar1 = 0;
  }
  else {
    uVar3 = 0;
    if (parentId != 0xffffffff) {
      uVar3 = parentId;
    }
    pZVar4 = (this->_namedLabels).super_ZoneHashBase._data
             [(uVar1 ^ uVar3) -
              (int)((ulong)(this->_namedLabels).super_ZoneHashBase._rcpValue *
                    (ulong)(uVar1 ^ uVar3) >>
                   ((this->_namedLabels).super_ZoneHashBase._rcpShift & 0x3f)) *
              (this->_namedLabels).super_ZoneHashBase._bucketsCount];
    if (pZVar4 != (ZoneHashNode *)0x0) {
      uVar3 = (uint)nameSize_local;
      __n = nameSize_local & 0xffffffff;
      do {
        if ((*(uint *)(pZVar4 + 0x30) == uVar3) && (*(uint32_t *)(pZVar4 + 0x14) == parentId)) {
          if (*(uint *)(pZVar4 + 0x30) < 0xc) {
            __s1 = pZVar4 + 0x34;
          }
          else {
            __s1 = *(ZoneHashNode **)(pZVar4 + 0x38);
          }
          iVar2 = bcmp(__s1,name,__n);
          if (iVar2 == 0) break;
        }
        pZVar4 = *(ZoneHashNode **)pZVar4;
      } while (pZVar4 != (ZoneHashNode *)0x0);
    }
    if (pZVar4 == (ZoneHashNode *)0x0) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = *(uint32_t *)(pZVar4 + 0xc);
    }
  }
  return uVar1;
}

Assistant:

uint32_t CodeHolder::labelIdByName(const char* name, size_t nameSize, uint32_t parentId) noexcept {
  uint32_t hashCode = CodeHolder_hashNameAndGetSize(name, nameSize);
  if (ASMJIT_UNLIKELY(!nameSize))
    return 0;

  if (parentId != Globals::kInvalidId)
    hashCode ^= parentId;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameSize, hashCode, parentId));
  return le ? le->id() : uint32_t(Globals::kInvalidId);
}